

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O1

int __thiscall asmjit::ZoneHashBase::_remove(ZoneHashBase *this,char *__filename)

{
  ZoneHashNode *pZVar1;
  ZoneHashNode *in_RDX;
  ZoneHashNode *pZVar2;
  
  pZVar1 = (ZoneHashNode *)
           (this->_data +
           (*(uint *)(in_RDX + 8) -
           (int)((ulong)this->_rcpValue * (ulong)*(uint *)(in_RDX + 8) >> (this->_rcpShift & 0x3f))
           * this->_bucketsCount));
  do {
    pZVar2 = pZVar1;
    pZVar1 = *(ZoneHashNode **)pZVar2;
    if (pZVar1 == (ZoneHashNode *)0x0) {
      return 0;
    }
  } while (pZVar1 != in_RDX);
  *(long *)pZVar2 = *(long *)pZVar1;
  this->_size = this->_size - 1;
  return (int)in_RDX;
}

Assistant:

ZoneHashNode* ZoneHashBase::_remove(ZoneAllocator* allocator, ZoneHashNode* node) noexcept {
  DebugUtils::unused(allocator);
  uint32_t hashMod = _calcMod(node->_hashCode);

  ZoneHashNode** pPrev = &_data[hashMod];
  ZoneHashNode* p = *pPrev;

  while (p) {
    if (p == node) {
      *pPrev = p->_hashNext;
      _size--;
      return node;
    }

    pPrev = &p->_hashNext;
    p = *pPrev;
  }

  return nullptr;
}